

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinSerializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  int *elem;
  const_iterator __end0;
  const_iterator __begin0;
  list<int,_std::allocator<int>_> *__range3;
  list<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  _List_const_iterator<int> *in_stack_ffffffffffffffc0;
  _Self local_38;
  _Self local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    in_stack_ffffffffffffffc0 =
         (_List_const_iterator<int> *)
         std::_List_const_iterator<int>::operator*(in_stack_ffffffffffffffc0);
    serialize<int,OutputStream>
              ((int *)in_stack_ffffffffffffffc0,(OutputStream *)in_stack_ffffffffffffffb8);
    std::_List_const_iterator<int>::operator++(&local_30);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }